

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)23,_(unsigned_short)0>::Pack
               (uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = in[1];
  *out = uVar1 << 0x17 | *in & 0x7fffff;
  uVar2 = in[2];
  out[1] = uVar2 << 0xe | uVar1 >> 9 & 0x3fff;
  out[2] = uVar2 >> 0x12 & 0x1f;
  Unroller<(unsigned_short)23,_(unsigned_short)3>::Pack(in,out + 2);
  return;
}

Assistant:

static void Pack(const uint32_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in<uint32_t, DELTA, (DELTA * OINDEX) % 32, (1U << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}